

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc.c
# Opt level: O0

void load_param_g_once(void)

{
  double dVar1;
  int local_6c;
  int i;
  char *env_names_o [5];
  long local_38;
  char *env_names_g [5];
  
  memcpy(&local_38,&PTR_anon_var_dwarf_36336_00147cb0,0x28);
  memcpy(&stack0xffffffffffffff98,&PTR_anon_var_dwarf_3638c_00147ce0,0x28);
  for (local_6c = 0; local_6c < 5; local_6c = local_6c + 1) {
    if (env_names_g[(long)local_6c + -1] != (char *)0x0) {
      dVar1 = load_param(env_names_g[(long)local_6c + -1],1.0,"bsc_g");
      s_g[local_6c] = dVar1;
      dVar1 = load_param(*(char **)(&stack0xffffffffffffff98 + (long)local_6c * 8),0.0,"bsc_g");
      s_o[local_6c] = dVar1;
    }
  }
  return;
}

Assistant:

static void load_param_g_once(void)
{
    const char * env_names_g[] = { 
        "BSC_PUT_G", "BSP_HPPUT_G", "BSP_GET_G",
        "BSP_HPGET_G", "BSP_SEND_G" } ;
    const char * env_names_o[] = { 
        "BSC_PUT_O", "BSP_HPPUT_O", "BSP_GET_O",
        "BSP_HPGET_O", "BSP_SEND_O" } ;
    int i;
    for ( i = 0; i < BSC_N_REQUEST_TYPES; ++i )
        if (env_names_g[i]) {
                s_g[i] = load_param(env_names_g[i], 1.0, "bsc_g");
                s_o[i] = load_param(env_names_o[i], 0.0, "bsc_g");
        }
}